

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_SetKnotVectorDomain(int order,int cv_count,double *knot,double t0,double t1)

{
  bool bVar1;
  char *sFormat;
  int line_number;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  ON_Interval newd;
  ON_Interval oldd;
  ON_Interval local_48;
  ON_Interval local_38;
  
  if (((((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) ||
      ((t1 <= t0 || (bVar1 = ON_IsValid(t0), !bVar1)))) || (bVar1 = ON_IsValid(t1), !bVar1)) {
    sFormat = "ON_SetKnotVectorDomain - invalid input";
    line_number = 0x244;
  }
  else {
    if (((knot[(ulong)(uint)order - 2] < knot[(ulong)(uint)cv_count - 1]) &&
        (bVar1 = ON_IsValid(knot[(ulong)(uint)order - 2]), bVar1)) &&
       (bVar1 = ON_IsValid(knot[(ulong)(uint)cv_count - 2]), bVar1)) {
      ON_Interval::ON_Interval
                (&local_38,knot[(ulong)(uint)order - 2],knot[(ulong)(uint)cv_count - 1]);
      ON_Interval::ON_Interval(&local_48,t0,t1);
      bVar1 = ON_Interval::operator!=(&local_38,&local_48);
      if (bVar1) {
        uVar2 = (order + cv_count) - 2;
        uVar4 = 0;
        uVar3 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar3 = uVar4;
        }
        for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          dVar5 = ON_Interval::NormalizedParameterAt(&local_38,knot[uVar4]);
          dVar5 = ON_Interval::ParameterAt(&local_48,dVar5);
          knot[uVar4] = dVar5;
        }
      }
      return true;
    }
    sFormat = "ON_SetKnotVectorDomain - invalid input knot vector";
    line_number = 0x24a;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_SetKnotVectorDomain( int order, int cv_count, double* knot, double t0, double t1 )
{
  bool rc = false;
  if ( order < 2 || cv_count < order || 0 == knot || t0 >= t1 || !ON_IsValid(t0) || !ON_IsValid(t1) )
  {
    ON_ERROR("ON_SetKnotVectorDomain - invalid input");
  }
  else if (    knot[order-2] >= knot[cv_count-1] 
            || !ON_IsValid(knot[order-2]) 
            || !ON_IsValid(knot[cv_count-2]) )
  {
    ON_ERROR("ON_SetKnotVectorDomain - invalid input knot vector");
  }
  else
  {
    const ON_Interval oldd(knot[order-2],knot[cv_count-1]);
    const ON_Interval newd(t0,t1);
    if ( oldd != newd )
    {
      int i, knot_count = ON_KnotCount(order,cv_count);
      for ( i = 0; i < knot_count; i++ )
      {
        knot[i] = newd.ParameterAt(oldd.NormalizedParameterAt(knot[i]));
      }
    }
    rc = true;
  }
  return rc;
}